

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType0::AddDataValue(GridDataType0 *this,KUINT8 D)

{
  KUINT8 local_11;
  GridDataType0 *pGStack_10;
  KUINT8 D_local;
  GridDataType0 *this_local;
  
  *(short *)&(this->super_GridData).field_0xc = *(short *)&(this->super_GridData).field_0xc + 1;
  local_11 = D;
  pGStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->m_vui8DataVals,&local_11);
  return;
}

Assistant:

void GridDataType0::AddDataValue( KUINT8 D )
{
    ++m_ui16NumBytes;
    m_vui8DataVals.push_back( D );
}